

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedWriteFragment::Setup(AdvancedWriteFragment *this)

{
  AdvancedWriteFragment *this_local;
  
  memset(this->m_program,0,8);
  this->m_storage_buffer = 0;
  this->m_counter_buffer = 0;
  this->m_attribless_vertex_array = 0;
  this->m_draw_vertex_array = 0;
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_fbo);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(m_program, 0, sizeof(m_program));
		m_storage_buffer		  = 0;
		m_counter_buffer		  = 0;
		m_attribless_vertex_array = 0;
		m_draw_vertex_array		  = 0;
		glGenFramebuffers(1, &m_fbo);
		glGenTextures(1, &m_rt);
		return NO_ERROR;
	}